

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  int mask;
  uint uVar3;
  int i;
  long lVar4;
  
  uVar3 = 0x80;
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      return dest;
    }
    if ((uVar3 & channel) != 0) {
      iVar2 = stbi__at_eof(s);
      if (iVar2 != 0) {
        stbi__g_failure_reason = "bad file";
        return (stbi_uc *)0x0;
      }
      sVar1 = stbi__get8(s);
      dest[lVar4] = sVar1;
    }
    lVar4 = lVar4 + 1;
    uVar3 = uVar3 >> 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}